

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int isodate7_valid(uchar *v)

{
  return (int)(((byte)(v[6] + 0x30) < 0x65 && (v[5] < 0x3e && v[4] < 0x3c)) &&
              ((v[3] < 0x18 && ((byte)(v[2] - 1) < 0x1f && (byte)(v[1] - 1) < 0xc)) &&
              ((v[6] != '\0' || (v[5] != 0 || v[4] != 0)) ||
              ((v[3] != 0 || v[2] != '\0') || (v[1] != '\0' || *v != '\0')))));
}

Assistant:

static int
isodate7_valid(const unsigned char *v)
{
	int year = v[0];
	int month = v[1];
	int day = v[2];
	int hour = v[3];
	int minute = v[4];
	int second = v[5];
	int gmt_off = (signed char)v[6];

	/* ECMA-119 9.1.5 "If all seven values are zero, it shall mean
	 * that the date is unspecified" */
	if (year == 0
	    && month == 0
	    && day == 0
	    && hour == 0
	    && minute == 0
	    && second == 0
	    && gmt_off == 0)
		return 0;
	/*
	 * Sanity-test each individual field
	 */
	/* Year can have any value */
	/* Month must be 1-12 */
	if (month < 1 || month > 12)
		return 0;
	/* Day must be 1-31 */
	if (day < 1 || day > 31)
		return 0;
	/* Hour must be 0-23 */
	if (hour > 23)
		return 0;
	/* Minute must be 0-59 */
	if (minute > 59)
		return 0;
	/* second must be 0-59 according to ECMA-119 9.1.5 */
	/* BUT: we should probably allow for the time being in UTC, which
	   allows up to 61 seconds in a minute in certain cases */
	if (second > 61)
		return 0;
	/* Offset from GMT must be -48 to +52 */
	if (gmt_off < -48 || gmt_off > +52)
		return 0;

	/* All tests pass, this is OK */
	return 1;
}